

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O1

SCC * __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::GetSCC
          (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this,
          Descriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  SCC *pSVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  NodeData NVar6;
  Descriptor *local_8;
  
  p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)[*(Descriptor **)(p_Var5 + 1) < descriptor]) {
    if (*(Descriptor **)(p_Var5 + 1) >= descriptor) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, descriptor < *(Descriptor **)(p_Var4 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  local_8 = descriptor;
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    NVar6 = DFS(this,descriptor);
    pSVar3 = NVar6.scc;
  }
  else {
    pmVar2 = std::
             map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
             ::operator[](&this->cache_,&local_8);
    pSVar3 = pmVar2->scc;
  }
  return pSVar3;
}

Assistant:

const SCC* GetSCC(const Descriptor* descriptor) {
    if (cache_.count(descriptor)) return cache_[descriptor].scc;
    return DFS(descriptor).scc;
  }